

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O2

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_PluralRulesSelect
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  int32_t iVar5;
  int32_t iVar6;
  charcount_t cchUseLength;
  charcount_t cVar7;
  undefined4 *puVar8;
  Var pvVar9;
  DynamicObject *stateObject;
  void **resource;
  Recycler *pRVar10;
  UChar *pUVar11;
  Recycler *pRVar12;
  LPCSTR pCVar13;
  char *message;
  JavascriptString *pJVar14;
  char *error;
  uint uVar15;
  uint in_stack_00000010;
  undefined1 local_128 [8];
  char localeID [157];
  FinalizableUPluralRules *local_78;
  FinalizableUPluralRules *pr;
  Var cachedUNumberFormat;
  Arguments args;
  FinalizableUPluralRules *local_48;
  FinalizableUNumberFormat *nf;
  double nWithOptions;
  UErrorCode status;
  UErrorCode status_2;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  uVar15 = callInfo._0_4_;
  if (in_stack_00000010 != uVar15) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xbe2,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00a30d78;
    *puVar8 = 0;
  }
  args.Info = (Type)&stack0x00000018;
  cachedUNumberFormat = (Var)callInfo;
  if ((uVar15 >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xbe2,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00a30d78;
    *puVar8 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if ((uVar15 & 0xffffff) == 3) {
    pvVar9 = Arguments::operator[]((Arguments *)&cachedUNumberFormat,1);
    bVar3 = DynamicObject::IsBaseDynamicObject(pvVar9);
    if (!bVar3) goto LAB_00a303e4;
  }
  else {
    if (((ulong)callInfo & 0xffffff) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xbe2,"(argCount > 0)","Should always have implicit \'this\'");
      if (!bVar3) goto LAB_00a30d78;
      *puVar8 = 0;
    }
LAB_00a303e4:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xbe3,
                                "((args.Info.Count == 3 && DynamicObject::IsBaseDynamicObject(args[1])))"
                                ,"Intl platform function given bad arguments");
    if (!bVar3) goto LAB_00a30d78;
    *puVar8 = 0;
  }
  pvVar9 = Arguments::operator[]((Arguments *)&cachedUNumberFormat,1);
  stateObject = UnsafeVarTo<Js::DynamicObject>(pvVar9);
  args.Values = (Type)0x0;
  pvVar9 = Arguments::operator[]((Arguments *)&cachedUNumberFormat,2);
  bVar3 = TaggedInt::Is(pvVar9);
  pvVar9 = Arguments::operator[]((Arguments *)&cachedUNumberFormat,2);
  if (bVar3) {
    args.Values = (Type)(double)(int)pvVar9;
  }
  else {
    if ((ulong)pvVar9 >> 0x32 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xbed,"(JavascriptNumber::Is(args[2]))",
                                  "JavascriptNumber::Is(args[2])");
      if (!bVar3) goto LAB_00a30d78;
      *puVar8 = 0;
    }
    pvVar9 = Arguments::operator[]((Arguments *)&cachedUNumberFormat,2);
    args.Values = (Type)JavascriptNumber::GetValue(pvVar9);
  }
  Output::Trace(IntlPhase,L"%S(): Calling PluralRules.prototype.select(%f)\n",
                "EntryIntl_PluralRulesSelect");
  nWithOptions._0_4_ = 0;
  local_78 = GetOrCreateCachedUPluralRules(stateObject,pSVar1);
  pr = (FinalizableUPluralRules *)0x0;
  local_48 = (FinalizableUPluralRules *)0x0;
  iVar4 = (*(stateObject->super_RecyclableObject).super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x14])
                    (stateObject,stateObject,10,&pr,0,pSVar1);
  if (iVar4 == 0) {
    memset((char (*) [157])local_128,0,0x9d);
    pJVar14 = AssertStringProperty(stateObject,(PropertyIds)0x20d);
    LangtagToLocaleID<157ul>(pJVar14,(char (*) [157])local_128);
    pRVar12 = pSVar1->recycler;
    resource = (void **)unum_open_70(1,0,0,(char (*) [157])local_128,0,&nWithOptions);
    local_48 = (FinalizableUPluralRules *)
               FinalizableICUObject<void_**,_&unum_close_70>::New(pRVar12,resource);
    SetUNumberFormatDigitOptions((UNumberFormat *)local_48->resource,stateObject);
    Output::Trace(IntlPhase,L"%S(): Caching UNumberFormat object (0x%x) with localeID %S\n",
                  "EntryIntl_PluralRulesSelect",local_48,(char (*) [157])local_128);
    (*(stateObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x19])(stateObject,10,local_48,0,0);
  }
  else {
    local_48 = pr;
    Output::Trace(IntlPhase,L"%S(): Using previously cached UNumberFormat (0x%x)\n",
                  "EntryIntl_PluralRulesSelect");
  }
  pRVar12 = pSVar1->recycler;
  unique0x00004780 = &local_48;
  nf = (FinalizableUNumberFormat *)((ulong)nf._4_4_ << 0x20);
  local_128 = (undefined1  [8])&char16_t::typeinfo;
  localeID[0] = '\0';
  localeID[1] = '\0';
  localeID[2] = '\0';
  localeID[3] = '\0';
  localeID[4] = '\0';
  localeID[5] = '\0';
  localeID[6] = '\0';
  localeID[7] = '\0';
  localeID[8] = '\b';
  localeID[9] = '\0';
  localeID[10] = '\0';
  localeID[0xb] = '\0';
  localeID[0xc] = '\0';
  localeID[0xd] = '\0';
  localeID[0xe] = '\0';
  localeID[0xf] = '\0';
  localeID._16_8_ = anon_var_dwarf_65688cc;
  localeID[0x18] = 'Y';
  localeID[0x19] = '\x01';
  localeID[0x1a] = '\0';
  localeID[0x1b] = '\0';
  pRVar10 = Memory::Recycler::TrackAllocInfo(pRVar12,(TrackAllocData *)local_128);
  pUVar11 = (UChar *)new__<Memory::Recycler>(0x10,pRVar10,0x37fe86);
  iVar5 = EntryIntl_PluralRulesSelect::anon_class_16_2_0ec11e41::operator()
                    ((anon_class_16_2_0ec11e41 *)(localeID + 0x98),pUVar11,8,(UErrorCode *)&nf);
  if (iVar5 < 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x15b,
                                "(allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0)",
                                "allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0");
    if (!bVar3) goto LAB_00a30d78;
    *puVar8 = 0;
  }
  if (((int)nf == 0xf) || ((int)nf == -0x7c)) {
    if (iVar5 < 8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x15e,"(*returnLength >= firstTryLength)",
                                  "Executor reported buffer failure but did not require additional space"
                                 );
      if (!bVar3) goto LAB_00a30d78;
      *puVar8 = 0;
    }
    uVar15 = iVar5 + 1;
    Output::Trace(IntlPhase,
                  L"%S(): Buffer of length %d was too short, retrying with buffer of length %d\n",
                  "EnsureBuffer",8,(ulong)uVar15);
    nf = (FinalizableUNumberFormat *)((ulong)nf & 0xffffffff00000000);
    local_128 = (undefined1  [8])&char16_t::typeinfo;
    localeID[0] = '\0';
    localeID[1] = '\0';
    localeID[2] = '\0';
    localeID[3] = '\0';
    localeID[4] = '\0';
    localeID[5] = '\0';
    localeID[6] = '\0';
    localeID[7] = '\0';
    localeID._16_8_ = anon_var_dwarf_65688cc;
    localeID[0x18] = 'b';
    localeID[0x19] = '\x01';
    localeID[0x1a] = '\0';
    localeID[0x1b] = '\0';
    localeID._8_8_ = (long)(int)uVar15;
    pRVar12 = Memory::Recycler::TrackAllocInfo(pRVar12,(TrackAllocData *)local_128);
    pUVar11 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                        ((Memory *)pRVar12,(Recycler *)Memory::Recycler::AllocLeaf,0,
                         (long)(int)uVar15);
    iVar6 = EntryIntl_PluralRulesSelect::anon_class_16_2_0ec11e41::operator()
                      ((anon_class_16_2_0ec11e41 *)(localeID + 0x98),pUVar11,uVar15,
                       (UErrorCode *)&nf);
    if (iVar6 != iVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x164,"(*returnLength == secondTryLength - 1)",
                                  "Second try of executor returned unexpected length");
      iVar5 = iVar6;
      goto joined_r0x00a30839;
    }
  }
  else if (7 < iVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x168,"(*returnLength < firstTryLength)",
                                "Executor required additional length but reported successful status"
                               );
joined_r0x00a30839:
    if (!bVar3) goto LAB_00a30d78;
    *puVar8 = 0;
  }
  if (0 < (int)nf || (int)nf == -0x7c) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    pCVar13 = (LPCSTR)u_errorName_70((ulong)nf & 0xffffffff);
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x16b,
                                "(!(U_FAILURE(status) || status == U_STRING_NOT_TERMINATED_WARNING))"
                                ,pCVar13);
    if (!bVar3) goto LAB_00a30d78;
    *puVar8 = 0;
  }
  nf = (FinalizableUNumberFormat *)
       unum_parseDouble_70(local_48->resource,pUVar11,iVar5,0,&nWithOptions);
  if (nWithOptions._0_4_ == 7) {
    Throw::OutOfMemory();
  }
  if (nWithOptions._0_4_ < 1 && nWithOptions._0_4_ != -0x7c) {
    if ((((((((double)args.Values <= 0.0) || ((double)nf < 0.0)) ||
           ((double)args.Values < (double)nf)) &&
          (((0.0 <= (double)args.Values || (0.0 < (double)nf)) || ((double)nf < (double)args.Values)
           ))) && ((((double)args.Values != 0.0 || (NAN((double)args.Values))) ||
                   (((double)nf != 0.0 || (NAN((double)nf))))))) &&
        ((((double)args.Values <= 0.0 || ((double)nf < 0.0)) || ((double)args.Values < (double)nf)))
        ) && (((0.0 <= (double)args.Values || (0.0 < (double)nf)) ||
              ((double)nf < (double)args.Values)))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      error = 
      "((n > 0.0 && nWithOptions <= n && nWithOptions >= 0.0) || (n < 0.0 && nWithOptions >= n && nWithOptions <= 0) || (n == 0.0 && nWithOptions == 0))"
      ;
      message = 
      "(n > 0.0 && nWithOptions <= n && nWithOptions >= 0.0) || (n < 0.0 && nWithOptions >= n && nWithOptions <= 0) || (n == 0.0 && nWithOptions == 0)"
      ;
      goto LAB_00a3098d;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    message = (char *)u_errorName_70(nWithOptions._0_4_);
    error = "(false)";
LAB_00a3098d:
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xc1d,error,message);
    if (!bVar3) goto LAB_00a30d78;
    *puVar8 = 0;
  }
  pRVar12 = pSVar1->recycler;
  unique0x00004780 = &local_78;
  nWithOptions._4_4_ = 0;
  local_128 = (undefined1  [8])&char16_t::typeinfo;
  localeID[0] = '\0';
  localeID[1] = '\0';
  localeID[2] = '\0';
  localeID[3] = '\0';
  localeID[4] = '\0';
  localeID[5] = '\0';
  localeID[6] = '\0';
  localeID[7] = '\0';
  localeID[8] = '\b';
  localeID[9] = '\0';
  localeID[10] = '\0';
  localeID[0xb] = '\0';
  localeID[0xc] = '\0';
  localeID[0xd] = '\0';
  localeID[0xe] = '\0';
  localeID[0xf] = '\0';
  localeID._16_8_ = anon_var_dwarf_65688cc;
  localeID[0x18] = 'Y';
  localeID[0x19] = '\x01';
  localeID[0x1a] = '\0';
  localeID[0x1b] = '\0';
  pRVar10 = Memory::Recycler::TrackAllocInfo(pRVar12,(TrackAllocData *)local_128);
  pUVar11 = (UChar *)new__<Memory::Recycler>(0x10,pRVar10,0x37fe86);
  cchUseLength = EntryIntl_PluralRulesSelect::anon_class_16_2_7f00f5c1::operator()
                           ((anon_class_16_2_7f00f5c1 *)(localeID + 0x98),pUVar11,8,
                            (UErrorCode *)((long)&nWithOptions + 4));
  if ((int)cchUseLength < 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x15b,
                                "(allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0)",
                                "allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0");
    if (!bVar3) goto LAB_00a30d78;
    *puVar8 = 0;
  }
  if ((nWithOptions._4_4_ == 0xf) || (nWithOptions._4_4_ == -0x7c)) {
    if ((int)cchUseLength < 8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x15e,"(*returnLength >= firstTryLength)",
                                  "Executor reported buffer failure but did not require additional space"
                                 );
      if (!bVar3) goto LAB_00a30d78;
      *puVar8 = 0;
    }
    uVar15 = cchUseLength + 1;
    Output::Trace(IntlPhase,
                  L"%S(): Buffer of length %d was too short, retrying with buffer of length %d\n",
                  "EnsureBuffer",8,(ulong)uVar15);
    nWithOptions._4_4_ = 0;
    local_128 = (undefined1  [8])&char16_t::typeinfo;
    localeID[0] = '\0';
    localeID[1] = '\0';
    localeID[2] = '\0';
    localeID[3] = '\0';
    localeID[4] = '\0';
    localeID[5] = '\0';
    localeID[6] = '\0';
    localeID[7] = '\0';
    localeID._16_8_ = anon_var_dwarf_65688cc;
    localeID[0x18] = 'b';
    localeID[0x19] = '\x01';
    localeID[0x1a] = '\0';
    localeID[0x1b] = '\0';
    localeID._8_8_ = (long)(int)uVar15;
    pRVar12 = Memory::Recycler::TrackAllocInfo(pRVar12,(TrackAllocData *)local_128);
    pUVar11 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                        ((Memory *)pRVar12,(Recycler *)Memory::Recycler::AllocLeaf,0,
                         (long)(int)uVar15);
    cVar7 = EntryIntl_PluralRulesSelect::anon_class_16_2_7f00f5c1::operator()
                      ((anon_class_16_2_7f00f5c1 *)(localeID + 0x98),pUVar11,uVar15,
                       (UErrorCode *)((long)&nWithOptions + 4));
    if (cVar7 != cchUseLength) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x164,"(*returnLength == secondTryLength - 1)",
                                  "Second try of executor returned unexpected length");
      cchUseLength = cVar7;
      goto joined_r0x00a30ce5;
    }
  }
  else if (7 < (int)cchUseLength) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x168,"(*returnLength < firstTryLength)",
                                "Executor required additional length but reported successful status"
                               );
joined_r0x00a30ce5:
    if (!bVar3) goto LAB_00a30d78;
    *puVar8 = 0;
  }
  if (0 < nWithOptions._4_4_ || nWithOptions._4_4_ == -0x7c) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    pCVar13 = (LPCSTR)u_errorName_70(nWithOptions._4_4_);
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x16b,
                                "(!(U_FAILURE(status) || status == U_STRING_NOT_TERMINATED_WARNING))"
                                ,pCVar13);
    if (!bVar3) {
LAB_00a30d78:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  pJVar14 = JavascriptString::NewWithBuffer(pUVar11,cchUseLength,pSVar1);
  return pJVar14;
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_PluralRulesSelect(RecyclableObject *function, CallInfo callInfo, ...)
    {
#ifdef INTL_ICU
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);
        INTL_CHECK_ARGS(args.Info.Count == 3 && DynamicObject::IsBaseDynamicObject(args[1]));

        DynamicObject *state = UnsafeVarTo<DynamicObject>(args[1]);
        double n = 0.0;
        if (TaggedInt::Is(args[2]))
        {
            n = TaggedInt::ToDouble(args[2]);
        }
        else
        {
            AssertOrFailFast(JavascriptNumber::Is(args[2]));
            n = JavascriptNumber::GetValue(args[2]);
        }

        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(PluralRules_Prototype_select);
        INTL_TRACE("Calling PluralRules.prototype.select(%f)", n);

        UErrorCode status = U_ZERO_ERROR;

        FinalizableUPluralRules *pr = GetOrCreateCachedUPluralRules(state, scriptContext);

        // ICU has an internal API, uplrules_selectWithFormat, that is equivalent to uplrules_select but will respect digit options of the passed UNumberFormat.
        // Since its an internal API, we can't use it -- however, we can work around it by creating a UNumberFormat with provided digit options,
        // formatting the requested number to a string, and then converting the string back to a double which we can pass to uplrules_select.
        // This workaround was suggested during the May 2018 ECMA-402 discussion.
        // The below is similar to GetOrCreateCachedUPluralRules, but since creating a UNumberFormat for Intl.NumberFormat is much more involved and no one else
        // uses this functionality, it makes more sense to me to just put the logic inline.
        Var cachedUNumberFormat = nullptr;
        FinalizableUNumberFormat *nf = nullptr;
        if (state->GetInternalProperty(state, InternalPropertyIds::CachedUNumberFormat, &cachedUNumberFormat, nullptr, scriptContext))
        {
            nf = reinterpret_cast<FinalizableUNumberFormat *>(cachedUNumberFormat);
            INTL_TRACE("Using previously cached UNumberFormat (0x%x)", nf);
        }
        else
        {
            char localeID[ULOC_FULLNAME_CAPACITY] = { 0 };
            LangtagToLocaleID(AssertStringProperty(state, PropertyIds::locale), localeID);
            nf = FinalizableUNumberFormat::New(scriptContext->GetRecycler(), unum_open(UNUM_DECIMAL, nullptr, 0, localeID, nullptr, &status));

            SetUNumberFormatDigitOptions(*nf, state);

            INTL_TRACE("Caching UNumberFormat object (0x%x) with localeID %S", nf, localeID);

            state->SetInternalProperty(InternalPropertyIds::CachedUNumberFormat, nf, PropertyOperationFlags::PropertyOperation_None, nullptr);
        }

        char16 *formattedN = nullptr;
        int formattedNLength = 0;
        EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
        {
            return unum_formatDouble(*nf, n, buf, bufLen, nullptr, status);
        }, scriptContext->GetRecycler(), &formattedN, &formattedNLength);

        double nWithOptions = unum_parseDouble(*nf, reinterpret_cast<UChar *>(formattedN), formattedNLength, nullptr, &status);

        ICU_ASSERT(status, (n > 0.0 && nWithOptions <= n && nWithOptions >= 0.0) ||
            (n < 0.0 && nWithOptions >= n && nWithOptions <= 0) ||
            (n == 0.0 && nWithOptions == 0));

        char16 *selected = nullptr;
        int selectedLength = 0;
        EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
        {
            return uplrules_select(*pr, nWithOptions, buf, bufLen, status);
        }, scriptContext->GetRecycler(), &selected, &selectedLength);

        return JavascriptString::NewWithBuffer(selected, static_cast<charcount_t>(selectedLength), scriptContext);
#else
        AssertOrFailFastMsg(false, "Intl-WinGlob should not be using PluralRulesSelect");
        return nullptr;
#endif
    }